

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  long lVar1;
  InternalRunDeathTestFlag *pIVar2;
  TestEventRepeater *pTVar3;
  pointer ppEVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  TimeInMillis TVar10;
  TimeInMillis TVar11;
  TestCase *this_00;
  int i;
  uint uVar12;
  byte bVar13;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar14;
  int test_index;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = GTestIsInitialized();
  bVar6 = true;
  if (g_help_flag == '\0') {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    pIVar2 = (this->internal_run_death_test_flag_).ptr_;
    bVar6 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                        pIVar2 != (InternalRunDeathTestFlag *)0x0);
    iVar7 = FilterTests(this,(uint)!bVar6);
    if (FLAGS_gtest_list_tests == '\x01') {
      ListTestsMatchingFilter(this);
      bVar6 = true;
    }
    else {
      iVar8 = 0;
      if (FLAGS_gtest_shuffle == '\x01') {
        iVar8 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
      }
      this->random_seed_ = iVar8;
      pTVar3 = (this->listeners_).repeater_;
      TVar10 = GetTimeInMillis();
      this->start_timestamp_ = TVar10;
      (*(pTVar3->super_TestEventListener)._vptr_TestEventListener[2])(pTVar3,this->parent_);
      uVar9 = FLAGS_gtest_repeat;
      if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
        uVar9 = 1;
      }
      bVar13 = 0;
      for (uVar12 = 0; uVar12 != uVar9 || (int)uVar9 < 0; uVar12 = uVar12 + 1) {
        ClearNonAdHocTestResult(this);
        TVar10 = GetTimeInMillis();
        if (iVar7 < 1) {
          (*(pTVar3->super_TestEventListener)._vptr_TestEventListener[3])
                    (pTVar3,this->parent_,(ulong)uVar12);
        }
        else {
          if (FLAGS_gtest_shuffle == '\x01') {
            (this->random_).state_ = this->random_seed_;
            ShuffleTests(this);
          }
          (*(pTVar3->super_TestEventListener)._vptr_TestEventListener[3])
                    (pTVar3,this->parent_,(ulong)uVar12);
          (*(pTVar3->super_TestEventListener)._vptr_TestEventListener[4])(pTVar3,this->parent_);
          ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                    (&this->environments_,SetUpEnvironment);
          (*(pTVar3->super_TestEventListener)._vptr_TestEventListener[5])(pTVar3,this->parent_);
          bVar6 = Test::HasFatalFailure();
          if (!bVar6) {
            for (iVar8 = 0;
                iVar8 < (int)((ulong)((long)(this->test_cases_).
                                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->test_cases_).
                                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
                iVar8 = iVar8 + 1) {
              this_00 = GetMutableTestCase(this,iVar8);
              TestCase::Run(this_00);
            }
          }
          (*(pTVar3->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar3,this->parent_);
          ppEVar4 = (this->environments_).
                    super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (ppEVar14 = (this->environments_).
                          super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish; ppEVar14 != ppEVar4;
              ppEVar14 = ppEVar14 + -1) {
            (**(code **)(*(long *)ppEVar14[-1] + 0x18))();
          }
          (*(pTVar3->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar3,this->parent_);
        }
        TVar11 = GetTimeInMillis();
        this->elapsed_time_ = TVar11 - TVar10;
        (*(pTVar3->super_TestEventListener)._vptr_TestEventListener[0xd])
                  (pTVar3,this->parent_,(ulong)uVar12);
        bVar6 = Passed(this);
        UnshuffleTests(this);
        if (FLAGS_gtest_shuffle == '\x01') {
          iVar8 = GetNextRandomSeed(this->random_seed_);
          this->random_seed_ = iVar8;
        }
        bVar13 = bVar13 | !bVar6;
      }
      (*(pTVar3->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar3,this->parent_);
      if (!bVar5) {
        ColoredPrintf(COLOR_RED,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      bVar6 = (bool)(bVar13 ^ 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True iff Google Test is initialized before RUN_ALL_TESTS() is called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True iff we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_.get() != NULL);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True iff at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool forever = repeat < 0;
  for (int i = 0; forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test cases and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(random_seed_);
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test case if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure during global
      // set-up.
      if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_case_count();
             test_index++) {
          GetMutableTestCase(test_index)->Run();
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        COLOR_RED,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(COLOR_RED,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}